

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

shared_ptr<CellType> __thiscall GameEngine::getCell(GameEngine *this,size_t posX,size_t posY)

{
  size_t sVar1;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar2;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<CellType> sVar4;
  
  sVar1 = Map::getWidth(*(Map **)posX);
  _Var3._M_pi = extraout_RDX;
  if (posY < sVar1) {
    sVar1 = Map::getHeight(*(Map **)posX);
    _Var3._M_pi = extraout_RDX_00;
    if (in_RCX < sVar1) {
      pvVar2 = Map::operator[](*(Map **)posX,in_RCX);
      std::__shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &(pvVar2->
                  super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[posY].
                  super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>);
      _Var3._M_pi = extraout_RDX_01;
      goto LAB_0013609f;
    }
  }
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0013609f:
  sVar4.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<CellType>)sVar4.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CellType> GameEngine::getCell(size_t posX, size_t posY) {
  if ((posX >= 0) && (posY >= 0) && (posX < map->getWidth()) && (posY < map->getHeight())) {
    return (*map)[posY][posX];
  } else {
    return nullptr;
  }
}